

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void setResultStrOrError(sqlite3_context *pCtx,char *z,int n,u8 enc,_func_void_void_ptr *xDel)

{
  Mem *p;
  int iVar1;
  _func_void_void_ptr *in_RDI;
  u8 unaff_retaddr;
  i64 in_stack_00000008;
  int rc;
  Mem *pOut;
  Mem *in_stack_ffffffffffffffc8;
  
  p = *(Mem **)in_RDI;
  iVar1 = sqlite3VdbeMemSetStr((Mem *)xDel,(char *)pOut,in_stack_00000008,unaff_retaddr,in_RDI);
  if (iVar1 == 0) {
    sqlite3VdbeChangeEncoding(in_stack_ffffffffffffffc8,0);
    iVar1 = sqlite3VdbeMemTooBig(p);
    if (iVar1 != 0) {
      sqlite3_result_error_toobig((sqlite3_context *)0x13e780);
    }
  }
  else if (iVar1 == 0x12) {
    sqlite3_result_error_toobig((sqlite3_context *)0x13e746);
  }
  else {
    sqlite3_result_error_nomem((sqlite3_context *)0x13e752);
  }
  return;
}

Assistant:

static void setResultStrOrError(
  sqlite3_context *pCtx,  /* Function context */
  const char *z,          /* String pointer */
  int n,                  /* Bytes in string, or negative */
  u8 enc,                 /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*)     /* Destructor function */
){
  Mem *pOut = pCtx->pOut;
  int rc = sqlite3VdbeMemSetStr(pOut, z, n, enc, xDel);
  if( rc ){
    if( rc==SQLITE_TOOBIG ){
      sqlite3_result_error_toobig(pCtx);
    }else{
      /* The only errors possible from sqlite3VdbeMemSetStr are
      ** SQLITE_TOOBIG and SQLITE_NOMEM */
      assert( rc==SQLITE_NOMEM );
      sqlite3_result_error_nomem(pCtx);
    }
    return;
  }
  sqlite3VdbeChangeEncoding(pOut, pCtx->enc);
  if( sqlite3VdbeMemTooBig(pOut) ){
    sqlite3_result_error_toobig(pCtx);
  }
}